

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::CopySceneFlat(aiScene **_dest,aiScene *src)

{
  undefined4 uVar1;
  aiScene *this;
  long lVar2;
  byte bVar3;
  
  bVar3 = 0;
  if (src != (aiScene *)0x0 && _dest != (aiScene **)0x0) {
    if (*_dest == (aiScene *)0x0) {
      this = (aiScene *)operator_new(0x80);
      aiScene::aiScene(this);
      *_dest = this;
    }
    else {
      aiScene::~aiScene(*_dest);
      aiScene::aiScene(*_dest);
      this = *_dest;
    }
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined4 *)&src->field_0x4;
      this->mFlags = src->mFlags;
      *(undefined4 *)&this->field_0x4 = uVar1;
      src = (aiScene *)((long)src + (ulong)bVar3 * -0x10 + 8);
      this = (aiScene *)((long)this + (ulong)bVar3 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopySceneFlat(aiScene** _dest,const aiScene* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    // reuse the old scene or allocate a new?
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    } else {
        *_dest = new aiScene();
    }

    ::memcpy(*_dest,src,sizeof(aiScene));
}